

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O1

void __thiscall HEkkPrimal::getBasicPrimalInfeasibility(HEkkPrimal *this)

{
  HighsInt *pHVar1;
  double dVar2;
  double dVar3;
  HEkk *pHVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x20,0);
  pHVar4 = this->ekk_instance_;
  dVar2 = (pHVar4->options_->super_HighsOptionsStruct).primal_feasibility_tolerance;
  (pHVar4->info_).num_primal_infeasibilities = 0;
  (pHVar4->info_).max_primal_infeasibility = 0.0;
  (pHVar4->info_).sum_primal_infeasibilities = 0.0;
  if (0 < this->num_row) {
    pdVar5 = (pHVar4->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (pHVar4->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (pHVar4->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      dVar10 = pdVar5[lVar8];
      dVar9 = pdVar6[lVar8];
      if (dVar9 - dVar2 <= dVar10) {
        dVar3 = pdVar7[lVar8];
        dVar9 = 0.0;
        if (dVar2 + dVar3 < dVar10) {
          dVar9 = dVar10 - dVar3;
        }
      }
      else {
        dVar9 = dVar9 - dVar10;
      }
      if (0.0 < dVar9) {
        if (dVar2 < dVar9) {
          pHVar1 = &(pHVar4->info_).num_primal_infeasibilities;
          *pHVar1 = *pHVar1 + 1;
        }
        dVar10 = (pHVar4->info_).max_primal_infeasibility;
        if (dVar10 <= dVar9) {
          dVar10 = dVar9;
        }
        (pHVar4->info_).max_primal_infeasibility = dVar10;
        (pHVar4->info_).sum_primal_infeasibilities =
             dVar9 + (pHVar4->info_).sum_primal_infeasibilities;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->num_row);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x20,0);
  return;
}

Assistant:

void HEkkPrimal::getBasicPrimalInfeasibility() {
  // Gets the num/max/sum of basic primal infeasibilities,
  analysis->simplexTimerStart(ComputePrIfsClock);
  const double primal_feasibility_tolerance =
      ekk_instance_.options_->primal_feasibility_tolerance;
  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsInt& num_primal_infeasibility = info.num_primal_infeasibilities;
  double& max_primal_infeasibility = info.max_primal_infeasibility;
  double& sum_primal_infeasibility = info.sum_primal_infeasibilities;
  const HighsInt updated_num_primal_infeasibility = num_primal_infeasibility;
  num_primal_infeasibility = 0;
  max_primal_infeasibility = 0;
  sum_primal_infeasibility = 0;

  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    double value = info.baseValue_[iRow];
    double lower = info.baseLower_[iRow];
    double upper = info.baseUpper_[iRow];
    // @primal_infeasibility calculation
    double primal_infeasibility = 0;
    if (value < lower - primal_feasibility_tolerance) {
      primal_infeasibility = lower - value;
    } else if (value > upper + primal_feasibility_tolerance) {
      primal_infeasibility = value - upper;
    }
    if (primal_infeasibility > 0) {
      if (primal_infeasibility > primal_feasibility_tolerance)
        num_primal_infeasibility++;
      max_primal_infeasibility =
          std::max(primal_infeasibility, max_primal_infeasibility);
      sum_primal_infeasibility += primal_infeasibility;
    }
  }
  if (updated_num_primal_infeasibility >= 0) {
    // The number of primal infeasibilities should be correct
    bool num_primal_infeasibility_ok =
        num_primal_infeasibility == updated_num_primal_infeasibility;
    // if (!num_primal_infeasibility_ok)
    //   printf("In iteration %" HIGHSINT_FORMAT
    //          ": num_primal_infeasibility = %" HIGHSINT_FORMAT
    //          " != %" HIGHSINT_FORMAT
    //          " = "
    //          "updated_num_primal_infeasibility\n",
    //          ekk_instance_.iteration_count_, num_primal_infeasibility,
    //          updated_num_primal_infeasibility);

    assert(num_primal_infeasibility_ok);
  }
  analysis->simplexTimerStop(ComputePrIfsClock);
}